

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall
doctest::anon_unknown_15::ConsoleReporter::report_query(ConsoleReporter *this,QueryData *in)

{
  ContextOptions *pCVar1;
  ConsoleReporter *in_RAX;
  ostream *poVar2;
  char *pcVar3;
  uint i;
  ulong uVar4;
  anon_class_8_1_8991fb9c printReporters;
  
  pCVar1 = this->opt;
  if (pCVar1->version == true) {
    printVersion(this);
    return;
  }
  printReporters.this = in_RAX;
  if (pCVar1->help == true) {
    printVersion(this);
    poVar2 = this->s;
    Color::operator<<(poVar2,Cyan);
    poVar2 = std::operator<<(poVar2,"[doctest]\n");
    Color::operator<<(poVar2,None);
    poVar2 = this->s;
    Color::operator<<(poVar2,Cyan);
    poVar2 = std::operator<<(poVar2,"[doctest] ");
    Color::operator<<(poVar2,None);
    std::operator<<(this->s,"boolean values: \"1/on/yes/true\" or \"0/off/no/false\"\n");
    poVar2 = this->s;
    Color::operator<<(poVar2,Cyan);
    poVar2 = std::operator<<(poVar2,"[doctest] ");
    Color::operator<<(poVar2,None);
    std::operator<<(this->s,"filter  values: \"str1,str2,str3\" (comma separated strings)\n");
    poVar2 = this->s;
    Color::operator<<(poVar2,Cyan);
    poVar2 = std::operator<<(poVar2,"[doctest]\n");
    Color::operator<<(poVar2,None);
    poVar2 = this->s;
    Color::operator<<(poVar2,Cyan);
    poVar2 = std::operator<<(poVar2,"[doctest] ");
    Color::operator<<(poVar2,None);
    std::operator<<(this->s,"filters use wildcards for matching strings\n");
    poVar2 = this->s;
    Color::operator<<(poVar2,Cyan);
    poVar2 = std::operator<<(poVar2,"[doctest] ");
    Color::operator<<(poVar2,None);
    std::operator<<(this->s,"something passes a filter if any of the strings in a filter matches\n")
    ;
    poVar2 = this->s;
    Color::operator<<(poVar2,Cyan);
    poVar2 = std::operator<<(poVar2,"[doctest]\n");
    Color::operator<<(poVar2,None);
    poVar2 = this->s;
    Color::operator<<(poVar2,Cyan);
    poVar2 = std::operator<<(poVar2,"[doctest] ");
    Color::operator<<(poVar2,None);
    std::operator<<(this->s,
                    "ALL FLAGS, OPTIONS AND FILTERS ALSO AVAILABLE WITH A \"dt-\" PREFIX!!!\n");
    poVar2 = this->s;
    Color::operator<<(poVar2,Cyan);
    poVar2 = std::operator<<(poVar2,"[doctest]\n");
    Color::operator<<(poVar2,None);
    poVar2 = this->s;
    Color::operator<<(poVar2,Cyan);
    poVar2 = std::operator<<(poVar2,"[doctest] ");
    Color::operator<<(poVar2,None);
    std::operator<<(this->s,"Query flags - the program quits after them. Available:\n\n");
    poVar2 = std::operator<<(this->s," -?,   --help, -h                      ");
    printReporters.this = (ConsoleReporter *)((ulong)printReporters.this._4_4_ << 0x20);
    operator<<(poVar2,(Whitespace *)&printReporters);
    std::operator<<(poVar2,"prints this message\n");
    poVar2 = std::operator<<(this->s," -v,   --version                       ");
    printReporters.this = printReporters.this & 0xffffffff00000000;
    operator<<(poVar2,(Whitespace *)&printReporters);
    std::operator<<(poVar2,"prints the version\n");
    poVar2 = std::operator<<(this->s," -c,   --count                         ");
    printReporters.this = printReporters.this & 0xffffffff00000000;
    operator<<(poVar2,(Whitespace *)&printReporters);
    std::operator<<(poVar2,"prints the number of matching tests\n");
    poVar2 = std::operator<<(this->s," -ltc, --list-test-cases               ");
    printReporters.this = printReporters.this & 0xffffffff00000000;
    operator<<(poVar2,(Whitespace *)&printReporters);
    std::operator<<(poVar2,"lists all matching tests by name\n");
    poVar2 = std::operator<<(this->s," -lts, --list-test-suites              ");
    printReporters.this = printReporters.this & 0xffffffff00000000;
    operator<<(poVar2,(Whitespace *)&printReporters);
    std::operator<<(poVar2,"lists all matching test suites\n");
    poVar2 = std::operator<<(this->s," -lr,  --list-reporters                ");
    printReporters.this = printReporters.this & 0xffffffff00000000;
    operator<<(poVar2,(Whitespace *)&printReporters);
    std::operator<<(poVar2,"lists all registered reporters\n\n");
    poVar2 = this->s;
    Color::operator<<(poVar2,Cyan);
    poVar2 = std::operator<<(poVar2,"[doctest] ");
    Color::operator<<(poVar2,None);
    std::operator<<(this->s,"The available <int>/<string> options/filters are:\n\n");
    poVar2 = std::operator<<(this->s," -tc,  --test-case=<filters>           ");
    printReporters.this = printReporters.this & 0xffffffff00000000;
    operator<<(poVar2,(Whitespace *)&printReporters);
    std::operator<<(poVar2,"filters     tests by their name\n");
    poVar2 = std::operator<<(this->s," -tce, --test-case-exclude=<filters>   ");
    printReporters.this = printReporters.this & 0xffffffff00000000;
    operator<<(poVar2,(Whitespace *)&printReporters);
    std::operator<<(poVar2,"filters OUT tests by their name\n");
    poVar2 = std::operator<<(this->s," -sf,  --source-file=<filters>         ");
    printReporters.this = printReporters.this & 0xffffffff00000000;
    operator<<(poVar2,(Whitespace *)&printReporters);
    std::operator<<(poVar2,"filters     tests by their file\n");
    poVar2 = std::operator<<(this->s," -sfe, --source-file-exclude=<filters> ");
    printReporters.this = printReporters.this & 0xffffffff00000000;
    operator<<(poVar2,(Whitespace *)&printReporters);
    std::operator<<(poVar2,"filters OUT tests by their file\n");
    poVar2 = std::operator<<(this->s," -ts,  --test-suite=<filters>          ");
    printReporters.this = printReporters.this & 0xffffffff00000000;
    operator<<(poVar2,(Whitespace *)&printReporters);
    std::operator<<(poVar2,"filters     tests by their test suite\n");
    poVar2 = std::operator<<(this->s," -tse, --test-suite-exclude=<filters>  ");
    printReporters.this = printReporters.this & 0xffffffff00000000;
    operator<<(poVar2,(Whitespace *)&printReporters);
    std::operator<<(poVar2,"filters OUT tests by their test suite\n");
    poVar2 = std::operator<<(this->s," -sc,  --subcase=<filters>             ");
    printReporters.this = printReporters.this & 0xffffffff00000000;
    operator<<(poVar2,(Whitespace *)&printReporters);
    std::operator<<(poVar2,"filters     subcases by their name\n");
    poVar2 = std::operator<<(this->s," -sce, --subcase-exclude=<filters>     ");
    printReporters.this = printReporters.this & 0xffffffff00000000;
    operator<<(poVar2,(Whitespace *)&printReporters);
    std::operator<<(poVar2,"filters OUT subcases by their name\n");
    poVar2 = std::operator<<(this->s," -r,   --reporters=<filters>           ");
    printReporters.this = printReporters.this & 0xffffffff00000000;
    operator<<(poVar2,(Whitespace *)&printReporters);
    std::operator<<(poVar2,"reporters to use (console is default)\n");
    poVar2 = std::operator<<(this->s," -o,   --out=<string>                  ");
    printReporters.this = printReporters.this & 0xffffffff00000000;
    operator<<(poVar2,(Whitespace *)&printReporters);
    std::operator<<(poVar2,"output filename\n");
    poVar2 = std::operator<<(this->s," -ob,  --order-by=<string>             ");
    printReporters.this = printReporters.this & 0xffffffff00000000;
    operator<<(poVar2,(Whitespace *)&printReporters);
    std::operator<<(poVar2,"how the tests should be ordered\n");
    poVar2 = this->s;
    printReporters.this = printReporters.this & 0xffffffff00000000;
    operator<<(poVar2,(Whitespace *)&printReporters);
    std::operator<<(poVar2,
                    "                                       <string> - [file/suite/name/rand/none]\n"
                   );
    poVar2 = std::operator<<(this->s," -rs,  --rand-seed=<int>               ");
    printReporters.this = printReporters.this & 0xffffffff00000000;
    operator<<(poVar2,(Whitespace *)&printReporters);
    std::operator<<(poVar2,"seed for random ordering\n");
    poVar2 = std::operator<<(this->s," -f,   --first=<int>                   ");
    printReporters.this = printReporters.this & 0xffffffff00000000;
    operator<<(poVar2,(Whitespace *)&printReporters);
    std::operator<<(poVar2,"the first test passing the filters to\n");
    poVar2 = this->s;
    printReporters.this = printReporters.this & 0xffffffff00000000;
    operator<<(poVar2,(Whitespace *)&printReporters);
    std::operator<<(poVar2,
                    "                                       execute - for range-based execution\n");
    poVar2 = std::operator<<(this->s," -l,   --last=<int>                    ");
    printReporters.this = printReporters.this & 0xffffffff00000000;
    operator<<(poVar2,(Whitespace *)&printReporters);
    std::operator<<(poVar2,"the last test passing the filters to\n");
    poVar2 = this->s;
    printReporters.this = printReporters.this & 0xffffffff00000000;
    operator<<(poVar2,(Whitespace *)&printReporters);
    std::operator<<(poVar2,
                    "                                       execute - for range-based execution\n");
    poVar2 = std::operator<<(this->s," -aa,  --abort-after=<int>             ");
    printReporters.this = printReporters.this & 0xffffffff00000000;
    operator<<(poVar2,(Whitespace *)&printReporters);
    std::operator<<(poVar2,"stop after <int> failed assertions\n");
    poVar2 = std::operator<<(this->s," -scfl,--subcase-filter-levels=<int>   ");
    printReporters.this = printReporters.this & 0xffffffff00000000;
    operator<<(poVar2,(Whitespace *)&printReporters);
    std::operator<<(poVar2,"apply filters for the first <int> levels\n");
    poVar2 = this->s;
    Color::operator<<(poVar2,Cyan);
    poVar2 = std::operator<<(poVar2,"\n[doctest] ");
    Color::operator<<(poVar2,None);
    std::operator<<(this->s,
                    "Bool options - can be used like flags and true is assumed. Available:\n\n");
    poVar2 = std::operator<<(this->s," -s,   --success=<bool>                ");
    printReporters.this = printReporters.this & 0xffffffff00000000;
    operator<<(poVar2,(Whitespace *)&printReporters);
    std::operator<<(poVar2,"include successful assertions in output\n");
    poVar2 = std::operator<<(this->s," -cs,  --case-sensitive=<bool>         ");
    printReporters.this = printReporters.this & 0xffffffff00000000;
    operator<<(poVar2,(Whitespace *)&printReporters);
    std::operator<<(poVar2,"filters being treated as case sensitive\n");
    poVar2 = std::operator<<(this->s," -e,   --exit=<bool>                   ");
    printReporters.this = printReporters.this & 0xffffffff00000000;
    operator<<(poVar2,(Whitespace *)&printReporters);
    std::operator<<(poVar2,"exits after the tests finish\n");
    poVar2 = std::operator<<(this->s," -d,   --duration=<bool>               ");
    printReporters.this = printReporters.this & 0xffffffff00000000;
    operator<<(poVar2,(Whitespace *)&printReporters);
    std::operator<<(poVar2,"prints the time duration of each test\n");
    poVar2 = std::operator<<(this->s," -m,   --minimal=<bool>                ");
    printReporters.this = printReporters.this & 0xffffffff00000000;
    operator<<(poVar2,(Whitespace *)&printReporters);
    std::operator<<(poVar2,"minimal console output (only failures)\n");
    poVar2 = std::operator<<(this->s," -q,   --quiet=<bool>                  ");
    printReporters.this = printReporters.this & 0xffffffff00000000;
    operator<<(poVar2,(Whitespace *)&printReporters);
    std::operator<<(poVar2,"no console output\n");
    poVar2 = std::operator<<(this->s," -nt,  --no-throw=<bool>               ");
    printReporters.this = printReporters.this & 0xffffffff00000000;
    operator<<(poVar2,(Whitespace *)&printReporters);
    std::operator<<(poVar2,"skips exceptions-related assert checks\n");
    poVar2 = std::operator<<(this->s," -ne,  --no-exitcode=<bool>            ");
    printReporters.this = printReporters.this & 0xffffffff00000000;
    operator<<(poVar2,(Whitespace *)&printReporters);
    std::operator<<(poVar2,"returns (or exits) always with success\n");
    poVar2 = std::operator<<(this->s," -nr,  --no-run=<bool>                 ");
    printReporters.this = printReporters.this & 0xffffffff00000000;
    operator<<(poVar2,(Whitespace *)&printReporters);
    std::operator<<(poVar2,"skips all runtime doctest operations\n");
    poVar2 = std::operator<<(this->s," -ni,  --no-intro=<bool>               ");
    printReporters.this = printReporters.this & 0xffffffff00000000;
    operator<<(poVar2,(Whitespace *)&printReporters);
    std::operator<<(poVar2,"omit the framework intro in the output\n");
    poVar2 = std::operator<<(this->s," -nv,  --no-version=<bool>             ");
    printReporters.this = printReporters.this & 0xffffffff00000000;
    operator<<(poVar2,(Whitespace *)&printReporters);
    std::operator<<(poVar2,"omit the framework version in the output\n");
    poVar2 = std::operator<<(this->s," -nc,  --no-colors=<bool>              ");
    printReporters.this = printReporters.this & 0xffffffff00000000;
    operator<<(poVar2,(Whitespace *)&printReporters);
    std::operator<<(poVar2,"disables colors in output\n");
    poVar2 = std::operator<<(this->s," -fc,  --force-colors=<bool>           ");
    printReporters.this = printReporters.this & 0xffffffff00000000;
    operator<<(poVar2,(Whitespace *)&printReporters);
    std::operator<<(poVar2,"use colors even when not in a tty\n");
    poVar2 = std::operator<<(this->s," -nb,  --no-breaks=<bool>              ");
    printReporters.this = printReporters.this & 0xffffffff00000000;
    operator<<(poVar2,(Whitespace *)&printReporters);
    std::operator<<(poVar2,"disables breakpoints in debuggers\n");
    poVar2 = std::operator<<(this->s," -ns,  --no-skip=<bool>                ");
    printReporters.this = printReporters.this & 0xffffffff00000000;
    operator<<(poVar2,(Whitespace *)&printReporters);
    std::operator<<(poVar2,"don\'t skip test cases marked as skip\n");
    poVar2 = std::operator<<(this->s," -gfl, --gnu-file-line=<bool>          ");
    printReporters.this = printReporters.this & 0xffffffff00000000;
    operator<<(poVar2,(Whitespace *)&printReporters);
    std::operator<<(poVar2,":n: vs (n): for line numbers in output\n");
    poVar2 = std::operator<<(this->s," -npf, --no-path-filenames=<bool>      ");
    printReporters.this = printReporters.this & 0xffffffff00000000;
    operator<<(poVar2,(Whitespace *)&printReporters);
    std::operator<<(poVar2,"only filenames and no paths in output\n");
    poVar2 = std::operator<<(this->s," -nln, --no-line-numbers=<bool>        ");
    printReporters.this = printReporters.this & 0xffffffff00000000;
    operator<<(poVar2,(Whitespace *)&printReporters);
    std::operator<<(poVar2,"0 instead of real line numbers in output\n");
    poVar2 = this->s;
    Color::operator<<(poVar2,Cyan);
    poVar2 = std::operator<<(poVar2,"\n[doctest] ");
    Color::operator<<(poVar2,None);
    poVar2 = this->s;
    pcVar3 = "for more information visit the project documentation\n\n";
  }
  else {
    if (pCVar1->list_reporters == true) {
      printVersion(this);
      printReporters.this = this;
      getListeners();
      printRegisteredReporters::anon_class_8_1_8991fb9c::operator()
                (&printReporters,&getListeners::data,"listeners");
      getReporters();
      printRegisteredReporters::anon_class_8_1_8991fb9c::operator()
                (&printReporters,&getReporters::data,"reporters");
      return;
    }
    if ((pCVar1->count == false) && ((pCVar1->list_test_cases & 1U) == 0)) {
      if (pCVar1->list_test_suites != true) {
        return;
      }
      poVar2 = this->s;
      Color::operator<<(poVar2,Cyan);
      poVar2 = std::operator<<(poVar2,"[doctest] ");
      Color::operator<<(poVar2,None);
      std::operator<<(poVar2,"listing all test suites\n");
      separator_to_stream(this);
      for (uVar4 = 0; uVar4 < in->num_data; uVar4 = uVar4 + 1) {
        poVar2 = this->s;
        Color::operator<<(poVar2,None);
        poVar2 = std::operator<<(poVar2,in->data[uVar4]->m_test_suite);
        std::operator<<(poVar2,"\n");
      }
      separator_to_stream(this);
      poVar2 = this->s;
      Color::operator<<(poVar2,Cyan);
      poVar2 = std::operator<<(poVar2,"[doctest] ");
      Color::operator<<(poVar2,None);
      poVar2 = std::operator<<(poVar2,"unskipped test cases passing the current filters: ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      pcVar3 = "\n";
      std::operator<<(poVar2,"\n");
      poVar2 = this->s;
      Color::operator<<(poVar2,Cyan);
      poVar2 = std::operator<<(poVar2,"[doctest] ");
      Color::operator<<(poVar2,None);
      poVar2 = std::operator<<(poVar2,
                               "test suites with unskipped test cases passing the current filters: "
                              );
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    }
    else {
      if ((pCVar1->list_test_cases & 1U) != 0) {
        poVar2 = this->s;
        Color::operator<<(poVar2,Cyan);
        poVar2 = std::operator<<(poVar2,"[doctest] ");
        Color::operator<<(poVar2,None);
        std::operator<<(poVar2,"listing all test case names\n");
        separator_to_stream(this);
      }
      for (uVar4 = 0; uVar4 < in->num_data; uVar4 = uVar4 + 1) {
        poVar2 = this->s;
        Color::operator<<(poVar2,None);
        poVar2 = std::operator<<(poVar2,in->data[uVar4]->m_name);
        std::operator<<(poVar2,"\n");
      }
      separator_to_stream(this);
      poVar2 = this->s;
      Color::operator<<(poVar2,Cyan);
      poVar2 = std::operator<<(poVar2,"[doctest] ");
      Color::operator<<(poVar2,None);
      poVar2 = std::operator<<(poVar2,"unskipped test cases passing the current filters: ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      pcVar3 = "\n";
    }
  }
  std::operator<<(poVar2,pcVar3);
  return;
}

Assistant:

void report_query(const QueryData& in) override {
            if(opt.version) {
                printVersion();
            } else if(opt.help) {
                printHelp();
            } else if(opt.list_reporters) {
                printRegisteredReporters();
            } else if(opt.count || opt.list_test_cases) {
                if(opt.list_test_cases) {
                    s << Color::Cyan << "[doctest] " << Color::None
                      << "listing all test case names\n";
                    separator_to_stream();
                }

                for(unsigned i = 0; i < in.num_data; ++i)
                    s << Color::None << in.data[i]->m_name << "\n";

                separator_to_stream();

                s << Color::Cyan << "[doctest] " << Color::None
                  << "unskipped test cases passing the current filters: "
                  << g_cs->numTestCasesPassingFilters << "\n";

            } else if(opt.list_test_suites) {
                s << Color::Cyan << "[doctest] " << Color::None << "listing all test suites\n";
                separator_to_stream();

                for(unsigned i = 0; i < in.num_data; ++i)
                    s << Color::None << in.data[i]->m_test_suite << "\n";

                separator_to_stream();

                s << Color::Cyan << "[doctest] " << Color::None
                  << "unskipped test cases passing the current filters: "
                  << g_cs->numTestCasesPassingFilters << "\n";
                s << Color::Cyan << "[doctest] " << Color::None
                  << "test suites with unskipped test cases passing the current filters: "
                  << g_cs->numTestSuitesPassingFilters << "\n";
            }
        }